

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vpbroadcastb2(PDISASM pMyDisasm)

{
  UInt8 *modrm;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          strcpy((pMyDisasm->Instruction).Mnemonic,"vpbroadcastb");
          if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
            (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
          }
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
          (pMyDisasm->Instruction).Category = 0x140000;
          if ((pMyDisasm->Reserved_).VEX.L == '\0') {
            (pMyDisasm->Reserved_).Register_ = 4;
          }
          else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
            (pMyDisasm->Reserved_).Register_ = 8;
          }
          else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
            (pMyDisasm->Reserved_).Register_ = 0x10;
          }
          decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Reserved_).Register_ = 0;
          (pMyDisasm->Reserved_).OperandSize = 8;
          decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          if ((pMyDisasm->Reserved_).MOD_ != 3) {
            (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
          }
          (pMyDisasm->Reserved_).EIP_ =
               (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vpbroadcastb2(PDISASM pMyDisasm)
{
  UInt8* modrm;
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        modrm = (UInt8*) (GV.EIP_ + 1);
        GV.MOD_ = (*modrm >> 6) & 0x3;
        if (GV.MOD_ != 3) {
          failDecode(pMyDisasm);
          return;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpbroadcastb");
        #endif
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        GV.EVEX.tupletype = TUPLE1_SCALAR;
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        if (GV.VEX.L == 0) {
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.Register_ = AVX512_REG;
        }
        decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
        GV.Register_ = 0;
        GV.OperandSize = 8;
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        if (GV.MOD_ != 3) GV.ERROR_OPCODE = UD_;
        GV.EIP_ += GV.DECALAGE_EIP+2;
      }
      else {
        failDecode(pMyDisasm);
      }

    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}